

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

void fill_window(deflate_state *s)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  Bytef *pBVar6;
  Posf *pPVar7;
  uint uVar8;
  byte bVar9;
  uInt uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar14;
  ulong uVar15;
  size_t __n;
  ulg uVar16;
  ulong uVar17;
  bool bVar18;
  ulong uVar13;
  
  uVar4 = s->w_size;
  uVar11 = s->lookahead;
  while( true ) {
    uVar11 = (int)s->window_size - (uVar11 + s->strstart);
    if (s->w_size + (uVar4 - 0x106) <= s->strstart) {
      memcpy(s->window,s->window + uVar4,(ulong)(uVar4 - uVar11));
      uVar1 = s->strstart;
      uVar2 = s->match_start;
      s->strstart = uVar1 - uVar4;
      s->match_start = uVar2 - uVar4;
      s->block_start = s->block_start - (ulong)uVar4;
      slide_hash(s);
      uVar11 = uVar11 + uVar4;
    }
    if (s->strm->avail_in == 0) break;
    uVar11 = read_buf(s->strm,s->window + (ulong)s->lookahead + (ulong)s->strstart,uVar11);
    uVar11 = uVar11 + s->lookahead;
    s->lookahead = uVar11;
    uVar10 = s->insert;
    if (2 < uVar10 + uVar11) {
      uVar12 = s->strstart - uVar10;
      uVar13 = (ulong)uVar12;
      pBVar6 = s->window;
      bVar3 = pBVar6[uVar13];
      s->ins_h = (uint)bVar3;
      bVar9 = (byte)s->hash_shift;
      uVar5 = s->hash_mask;
      uVar12 = ((uint)pBVar6[uVar12 + 1] ^ (uint)bVar3 << (bVar9 & 0x1f)) & uVar5;
      s->ins_h = uVar12;
      do {
        bVar18 = uVar10 == 0;
        uVar10 = uVar10 - 1;
        if (bVar18) break;
        uVar8 = (uint)uVar13;
        uVar12 = ((uint)pBVar6[uVar8 + 2] ^ uVar12 << (bVar9 & 0x1f)) & uVar5;
        s->ins_h = uVar12;
        pPVar7 = s->head;
        s->prev[s->w_mask & uVar8] = pPVar7[uVar12];
        pPVar7[uVar12] = (Posf)uVar13;
        uVar13 = (ulong)(uVar8 + 1);
        s->insert = uVar10;
      } while (2 < uVar11 + uVar10);
    }
    if ((0x105 < uVar11) || (s->strm->avail_in == 0)) break;
  }
  uVar13 = s->high_water;
  uVar15 = s->window_size;
  uVar17 = uVar15 - uVar13;
  if (uVar13 <= uVar15 && uVar17 != 0) {
    uVar14 = (ulong)s->lookahead + (ulong)s->strstart;
    if (uVar13 < uVar14) {
      __n = uVar15 - uVar14;
      if (0x101 < __n) {
        __n = 0x102;
      }
      memset(s->window + uVar14,0,__n);
      uVar16 = __n + uVar14;
    }
    else {
      uVar15 = (uVar14 + 0x102) - uVar13;
      if (uVar14 + 0x102 < uVar13 || uVar15 == 0) {
        return;
      }
      if (uVar15 < uVar17) {
        uVar17 = uVar15;
      }
      memset(s->window + uVar13,0,uVar17 & 0xffffffff);
      uVar16 = uVar17 + s->high_water;
    }
    s->high_water = uVar16;
  }
  return;
}

Assistant:

local void fill_window(s)
    deflate_state *s;
{
    unsigned n;
    unsigned more;    /* Amount of free space at the end of the window. */
    uInt wsize = s->w_size;

    Assert(s->lookahead < MIN_LOOKAHEAD, "already enough lookahead");

    do {
        more = (unsigned)(s->window_size -(ulg)s->lookahead -(ulg)s->strstart);

        /* Deal with !@#$% 64K limit: */
        if (sizeof(int) <= 2) {
            if (more == 0 && s->strstart == 0 && s->lookahead == 0) {
                more = wsize;

            } else if (more == (unsigned)(-1)) {
                /* Very unlikely, but possible on 16 bit machine if
                 * strstart == 0 && lookahead == 1 (input done a byte at time)
                 */
                more--;
            }
        }

        /* If the window is almost full and there is insufficient lookahead,
         * move the upper half to the lower one to make room in the upper half.
         */
        if (s->strstart >= wsize+MAX_DIST(s)) {

            zmemcpy(s->window, s->window+wsize, (unsigned)wsize - more);
            s->match_start -= wsize;
            s->strstart    -= wsize; /* we now have strstart >= MAX_DIST */
            s->block_start -= (long) wsize;
            slide_hash(s);
            more += wsize;
        }
        if (s->strm->avail_in == 0) break;

        /* If there was no sliding:
         *    strstart <= WSIZE+MAX_DIST-1 && lookahead <= MIN_LOOKAHEAD - 1 &&
         *    more == window_size - lookahead - strstart
         * => more >= window_size - (MIN_LOOKAHEAD-1 + WSIZE + MAX_DIST-1)
         * => more >= window_size - 2*WSIZE + 2
         * In the BIG_MEM or MMAP case (not yet supported),
         *   window_size == input_size + MIN_LOOKAHEAD  &&
         *   strstart + s->lookahead <= input_size => more >= MIN_LOOKAHEAD.
         * Otherwise, window_size == 2*WSIZE so more >= 2.
         * If there was sliding, more >= WSIZE. So in all cases, more >= 2.
         */
        Assert(more >= 2, "more < 2");

        n = read_buf(s->strm, s->window + s->strstart + s->lookahead, more);
        s->lookahead += n;

        /* Initialize the hash value now that we have some input: */
        if (s->lookahead + s->insert >= MIN_MATCH) {
            uInt str = s->strstart - s->insert;
            s->ins_h = s->window[str];
            UPDATE_HASH(s, s->ins_h, s->window[str + 1]);
#if MIN_MATCH != 3
            Call UPDATE_HASH() MIN_MATCH-3 more times
#endif
            while (s->insert) {
                UPDATE_HASH(s, s->ins_h, s->window[str + MIN_MATCH-1]);
#ifndef FASTEST
                s->prev[str & s->w_mask] = s->head[s->ins_h];
#endif
                s->head[s->ins_h] = (Pos)str;
                str++;
                s->insert--;
                if (s->lookahead + s->insert < MIN_MATCH)
                    break;
            }
        }
        /* If the whole input has less than MIN_MATCH bytes, ins_h is garbage,
         * but this is not important since only literal bytes will be emitted.
         */

    } while (s->lookahead < MIN_LOOKAHEAD && s->strm->avail_in != 0);

    /* If the WIN_INIT bytes after the end of the current data have never been
     * written, then zero those bytes in order to avoid memory check reports of
     * the use of uninitialized (or uninitialised as Julian writes) bytes by
     * the longest match routines.  Update the high water mark for the next
     * time through here.  WIN_INIT is set to MAX_MATCH since the longest match
     * routines allow scanning to strstart + MAX_MATCH, ignoring lookahead.
     */
    if (s->high_water < s->window_size) {
        ulg curr = s->strstart + (ulg)(s->lookahead);
        ulg init;

        if (s->high_water < curr) {
            /* Previous high water mark below current data -- zero WIN_INIT
             * bytes or up to end of window, whichever is less.
             */
            init = s->window_size - curr;
            if (init > WIN_INIT)
                init = WIN_INIT;
            zmemzero(s->window + curr, (unsigned)init);
            s->high_water = curr + init;
        }
        else if (s->high_water < (ulg)curr + WIN_INIT) {
            /* High water mark at or above current data, but below current data
             * plus WIN_INIT -- zero out to current data plus WIN_INIT, or up
             * to end of window, whichever is less.
             */
            init = (ulg)curr + WIN_INIT - s->high_water;
            if (init > s->window_size - s->high_water)
                init = s->window_size - s->high_water;
            zmemzero(s->window + s->high_water, (unsigned)init);
            s->high_water += init;
        }
    }

    Assert((ulg)s->strstart <= s->window_size - MIN_LOOKAHEAD,
           "not enough room for search");
}